

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int GetNMEASentenceFromThreadubloxx(UBLOX *publox,NMEADATA *pNMEAData)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  NMEADATA *__src;
  
  __mutex = ubloxCS;
  __src = nmeadataublox;
  lVar2 = 0;
  do {
    if ((UBLOX *)addrsublox[lVar2] == publox) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      memcpy(pNMEAData,__src,0x3d8);
      iVar1 = resublox[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
    __src = __src + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetNMEASentenceFromThreadubloxx(UBLOX* publox, NMEADATA* pNMEAData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&ubloxCS[id]);
	*pNMEAData = nmeadataublox[id];
	res = resublox[id];
	LeaveCriticalSection(&ubloxCS[id]);

	return res;
}